

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

void __thiscall Apt::UpdateAltitudes(Apt *this)

{
  RwyEndPt *pRVar1;
  RwyEndPt *re;
  RwyEndPt *this_00;
  double dVar2;
  positionTy local_60;
  
  boundingBoxTy::center(&local_60,&this->bounds);
  dVar2 = YProbe_at_m(&local_60,&YProbe);
  this->alt_m = dVar2;
  pRVar1 = (this->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pRVar1; this_00 = this_00 + 1)
  {
    RwyEndPt::ComputeAlt(this_00,&YProbe);
  }
  return;
}

Assistant:

void UpdateAltitudes ()
    {
        // Airport: Center of boundaries
        alt_m = YProbe_at_m(bounds.center(), YProbe);
        
        // rwy ends
        for (RwyEndPt& re: vecRwyEndPts)            // for all rwy endpoints
            re.ComputeAlt(YProbe);
    }